

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::samplers::Sampler_testSamplerTags_Test::TestBody(Sampler_testSamplerTags_Test *this)

{
  long *plVar1;
  pointer pTVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  char **rhs;
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  *this_00;
  char *pcVar6;
  pointer pTVar7;
  long lVar8;
  int count;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> tags;
  ConstSampler constFalse;
  ConstSampler constTrue;
  ProbabilisticSampler prob;
  anon_struct_80_3_42a5a058 tests [4];
  RateLimitingSampler rate;
  long *local_2e8;
  undefined8 uStack_2e0;
  int local_2d4;
  long *local_2d0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c8;
  long local_2c0 [2];
  undefined1 local_2b0 [16];
  char local_2a0 [16];
  AssertHelper local_290 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_288;
  Value *local_270;
  ConstSampler local_268;
  ConstSampler local_240;
  ProbabilisticSampler local_218;
  ConstSampler *local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  local_1c0;
  ConstSampler *local_198;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  local_170;
  ProbabilisticSampler *local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  local_120;
  RateLimitingSampler *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  local_d0;
  RateLimitingSampler local_a0;
  
  ConstSampler::ConstSampler(&local_240,true);
  ConstSampler::ConstSampler(&local_268,false);
  ProbabilisticSampler::ProbabilisticSampler(&local_218,0.1);
  RateLimitingSampler::RateLimitingSampler(&local_a0,0.1);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  local_1e8 = &local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"const","");
  local_2b0[0] = (internal)0x1;
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<bool&,opentracing::v3::util::detail::value_traits<bool&,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            (&local_1c0,(bool *)local_2b0);
  local_190[0] = local_180;
  local_198 = &local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"const","");
  local_2b0._0_8_ = (ulong)(uint7)local_2b0._1_7_ << 8;
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<bool&,opentracing::v3::util::detail::value_traits<bool&,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            (&local_170,(bool *)local_2b0);
  local_140[0] = local_130;
  local_148 = &local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"probabilistic","");
  local_2b0._0_8_ = 0.1;
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<double,opentracing::v3::util::detail::value_traits<double,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            (&local_120,(double *)local_2b0);
  local_f0[0] = local_e0;
  local_f8 = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"ratelimiting","");
  local_2b0._0_8_ = (char *)0x3fb999999999999a;
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<double,opentracing::v3::util::detail::value_traits<double,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            (&local_d0,(double *)local_2b0);
  lVar8 = 0;
  do {
    plVar1 = *(long **)((long)&local_1e8 + lVar8);
    local_2e8 = (long *)0x0;
    uStack_2e0 = 0;
    local_2d0 = local_2c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"op","");
    (**(code **)(*plVar1 + 0x10))(local_2b0,plVar1,&local_2e8,(string *)&local_2d0);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
              (&local_288,
               (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(local_2b0 + 8));
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(local_2b0 + 8));
    if (local_2d0 != local_2c0) {
      operator_delete(local_2d0);
    }
    pTVar2 = local_288.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_2d4 = 0;
    if (local_288.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_288.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_270 = (Value *)((long)&local_1c0.type_index + lVar8);
      pTVar7 = local_288.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar5 = std::__cxx11::string::compare((char *)pTVar7);
        if (iVar5 == 0) {
          bVar3 = opentracing::v3::util::
                  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
                  ::is<char_const*>(&(pTVar7->_value).super_variant_type);
          local_2d0 = (long *)CONCAT71(local_2d0._1_7_,bVar3);
          local_2c8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!bVar3) {
            testing::Message::Message((Message *)&local_2e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)local_2b0,(char *)&local_2d0,
                       "tag.value().is<const char*>()","false");
            testing::internal::AssertHelper::AssertHelper
                      (local_290,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x59,(char *)local_2b0._0_8_);
            testing::internal::AssertHelper::operator=(local_290,(Message *)&local_2e8);
            testing::internal::AssertHelper::~AssertHelper(local_290);
            if ((char *)local_2b0._0_8_ != local_2a0) {
              operator_delete((void *)local_2b0._0_8_);
            }
            if (((local_2e8 != (long *)0x0) &&
                (cVar4 = testing::internal::IsTrue(true), cVar4 != '\0')) &&
               (local_2e8 != (long *)0x0)) {
              (**(code **)(*local_2e8 + 8))();
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_2c8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            goto LAB_001ba933;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_2c8,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          rhs = opentracing::v3::util::
                variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
                ::get<const_char_*,_nullptr>(&(pTVar7->_value).super_variant_type);
          testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                    ((internal *)local_2b0,"test._samplerType","tag.value().get<const char*>()",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&local_1e0._M_dataplus._M_p + lVar8),rhs);
          if (local_2b0[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_2d0);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = ((_Alloc_hider *)local_2b0._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_2e8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x5a,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_2e8,(Message *)&local_2d0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
            if (((local_2d0 != (long *)0x0) &&
                (cVar4 = testing::internal::IsTrue(true), cVar4 != '\0')) &&
               (local_2d0 != (long *)0x0)) {
              (**(code **)(*local_2d0 + 8))();
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_2b0 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            goto LAB_001ba933;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_2b0 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_001ba66c:
          local_2d4 = local_2d4 + 1;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)pTVar7);
          if (iVar5 == 0) {
            testing::internal::CmpHelperEQ<opentracing::v3::Value,opentracing::v3::Value>
                      ((internal *)local_2b0,"test._samplerParam","tag.value()",local_270,
                       &pTVar7->_value);
            if (local_2b0[0] != (internal)0x0) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_2b0 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              goto LAB_001ba66c;
            }
            testing::Message::Message((Message *)&local_2d0);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = ((_Alloc_hider *)local_2b0._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_2e8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x5e,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_2e8,(Message *)&local_2d0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
            if (((local_2d0 != (long *)0x0) &&
                (cVar4 = testing::internal::IsTrue(true), cVar4 != '\0')) &&
               (local_2d0 != (long *)0x0)) {
              (**(code **)(*local_2d0 + 8))();
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_2b0 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            goto LAB_001ba933;
          }
        }
        pTVar7 = pTVar7 + 1;
      } while (pTVar7 != pTVar2);
    }
    local_2d0 = (long *)CONCAT44(local_2d0._4_4_,2);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_2b0,"2","count",(int *)&local_2d0,&local_2d4);
    if (local_2b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_2d0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)local_2b0._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_2e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x62,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)&local_2d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
      if (((local_2d0 != (long *)0x0) && (cVar4 = testing::internal::IsTrue(true), cVar4 != '\0'))
         && (local_2d0 != (long *)0x0)) {
        (**(code **)(*local_2d0 + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_2b0 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_001ba933:
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_288);
      goto LAB_001ba93d;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_2b0 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_288);
    lVar8 = lVar8 + 0x50;
    if (lVar8 == 0x140) {
LAB_001ba93d:
      lVar8 = -0x140;
      this_00 = &local_d0;
      do {
        opentracing::v3::util::
        variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
        ::~variant(this_00);
        if ((anon_struct_8_0_00000001_for___align)((long)&this_00[-1].data + 0x10) !=
            this_00[-1].data.__align) {
          operator_delete((void *)this_00[-1].data.__align);
        }
        this_00 = this_00 + -2;
        lVar8 = lVar8 + 0x50;
      } while (lVar8 != 0);
      local_a0.super_Sampler._vptr_Sampler = (_func_int **)&PTR__RateLimitingSampler_0020dd18;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_a0._tags)
      ;
      local_218.super_Sampler._vptr_Sampler = (_func_int **)&PTR__ProbabilisticSampler_0020dcc8;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                (&local_218._tags);
      local_268.super_Sampler._vptr_Sampler = (_func_int **)&PTR__ConstSampler_0020dc68;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                (&local_268._tags);
      local_240.super_Sampler._vptr_Sampler = (_func_int **)&PTR__ConstSampler_0020dc68;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                (&local_240._tags);
      return;
    }
  } while( true );
}

Assistant:

TEST(Sampler, testSamplerTags)
{
    ConstSampler constTrue(true);
    ConstSampler constFalse(false);
    ProbabilisticSampler prob(0.1);
    RateLimitingSampler rate(0.1);

    const struct {
        Sampler& _sampler;
        std::string _samplerType;
        Tag::ValueType _samplerParam;
    } tests[] = { { constTrue, "const", true },
                  { constFalse, "const", false },
                  { prob, "probabilistic", 0.1 },
                  { rate, "ratelimiting", 0.1 } };

    for (auto&& test : tests) {
        const auto tags =
            test._sampler.isSampled(TraceID(), kTestOperationName).tags();
        auto count = 0;
        for (auto&& tag : tags) {
            if (tag.key() == kSamplerTypeTagKey) {
                ASSERT_TRUE(tag.value().is<const char*>());
                ASSERT_EQ(test._samplerType, tag.value().get<const char*>());
                ++count;
            }
            else if (tag.key() == kSamplerParamTagKey) {
                ASSERT_EQ(test._samplerParam, tag.value());
                ++count;
            }
        }
        ASSERT_EQ(2, count);
    }
}